

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O2

void __thiscall OpenTable::act(OpenTable *this,Restaurant *restaurant)

{
  ActionStatus AVar1;
  pointer ppCVar2;
  bool bVar3;
  Table *this_00;
  vector<Customer_*,_std::allocator<Customer_*>_> *this_01;
  Customer **customer;
  pointer ppCVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = Restaurant::getTable(restaurant,*(int *)&(this->super_BaseAction).field_0x2c);
  if ((this_00 == (Table *)0x0) || (bVar3 = Table::isOpen(this_00), bVar3)) {
    std::operator<<((ostream *)&std::cout,"Table does not exist or is already open\n");
    Restaurant::logOpenTableMsg_abi_cxx11_(&local_80,restaurant);
    std::operator+(&local_a0,"open ",&local_80);
    std::operator+(&local_40,&local_a0,"Error: Table does not exist or is already open");
    BaseAction::error(&this->super_BaseAction,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    AVar1 = (this->super_BaseAction).status;
    if (AVar1 == ERROR) {
      std::__cxx11::string::string((string *)&local_a0,(string *)&(this->super_BaseAction).errorMsg)
      ;
      std::__cxx11::string::append((string *)&this->completeMessage);
      std::__cxx11::string::~string((string *)&local_a0);
      return;
    }
    if (AVar1 != COMPLETED) goto LAB_001045a5;
  }
  else {
    Table::openTable(this_00);
    this_01 = Table::getCustomers(this_00);
    std::vector<Customer_*,_std::allocator<Customer_*>_>::operator=(this_01,&this->customers);
    (this->super_BaseAction).status = COMPLETED;
  }
  std::__cxx11::to_string(&local_60,*(int *)&(this->super_BaseAction).field_0x2c);
  std::operator+(&local_80,"open ",&local_60);
  std::operator+(&local_a0,&local_80," ");
  std::__cxx11::string::operator=((string *)&this->completeMessage,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  ppCVar2 = (this->customers).super__Vector_base<Customer_*,_std::allocator<Customer_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar4 = (this->customers).super__Vector_base<Customer_*,_std::allocator<Customer_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppCVar4 != ppCVar2; ppCVar4 = ppCVar4 + 1
      ) {
    (*(*ppCVar4)->_vptr_Customer[3])(&local_a0);
    std::__cxx11::string::append((string *)&this->completeMessage);
    std::__cxx11::string::~string((string *)&local_a0);
  }
LAB_001045a5:
  std::__cxx11::string::append((char *)&this->completeMessage);
  return;
}

Assistant:

void OpenTable::act(Restaurant &restaurant) {
    Table* temp = restaurant.getTable(tableId);
    if(temp == nullptr || temp->isOpen())
    {
        std::cout << "Table does not exist or is already open\n";
        error("open " + restaurant.logOpenTableMsg() + "Error: Table does not exist or is already open");
    }
    else
    {
        temp->openTable();
        temp->getCustomers() = customers;
        complete();
    }

    if(getStatus() == ActionStatus::COMPLETED)
    {

        completeMessage = "open " + std::to_string(tableId) + " " ;
        for (auto &customer : customers) {
            completeMessage.append(customer->toString());
        }
        completeMessage.append("Completed");
    }
    else  if(getStatus() == ActionStatus::ERROR)
    {
        completeMessage.append(getErrorMsg());
    }
    else completeMessage.append("Pending");

}